

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

DdNode * extraBddChangePolarity(DdManager *dd,DdNode *bFunc,DdNode *bVars)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *T;
  DdNode *pDVar8;
  DdNode *pDVar9;
  
  if (dd->one == bVars) {
    return bFunc;
  }
  pDVar8 = (DdNode *)((ulong)bFunc & 0xfffffffffffffffe);
  if (pDVar8->index == 0x7fffffff) {
    return bFunc;
  }
  pDVar5 = cuddCacheLookup2(dd,extraBddChangePolarity,bFunc,bVars);
  if (pDVar5 != (DdNode *)0x0) {
    return pDVar5;
  }
  iVar2 = dd->perm[pDVar8->index];
  iVar3 = dd->perm[bVars->index];
  if (iVar3 < iVar2) {
    pDVar6 = extraBddChangePolarity(dd,bFunc,(bVars->type).kids.T);
    goto LAB_00800a03;
  }
  pDVar5 = (pDVar8->type).kids.E;
  if (pDVar8 == bFunc) {
    pDVar7 = (pDVar8->type).kids.T;
  }
  else {
    pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
    pDVar7 = (DdNode *)((ulong)(pDVar8->type).kids.T ^ 1);
  }
  pDVar9 = bVars;
  if (iVar2 == iVar3) {
    pDVar9 = (bVars->type).kids.T;
  }
  pDVar5 = extraBddChangePolarity(dd,pDVar5,pDVar9);
  if (pDVar5 == (DdNode *)0x0) {
LAB_008009fa:
    bVar4 = false;
    pDVar6 = (DdNode *)0x0;
  }
  else {
    piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar7 = extraBddChangePolarity(dd,pDVar7,pDVar9);
    if (pDVar7 == (DdNode *)0x0) {
LAB_008009f5:
      Cudd_RecursiveDeref(dd,pDVar5);
      goto LAB_008009fa;
    }
    piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    T = pDVar7;
    pDVar9 = pDVar5;
    if (iVar2 == iVar3) {
      T = pDVar5;
      pDVar9 = pDVar7;
    }
    pDVar6 = T;
    if (pDVar7 != pDVar5) {
      if (((ulong)T & 1) == 0) {
        pDVar6 = cuddUniqueInter(dd,pDVar8->index,T,pDVar9);
        if (pDVar6 == (DdNode *)0x0) {
LAB_008009ea:
          Cudd_RecursiveDeref(dd,pDVar9);
          pDVar5 = T;
          goto LAB_008009f5;
        }
      }
      else {
        pDVar6 = cuddUniqueInter(dd,pDVar8->index,(DdNode *)((ulong)T & 0xfffffffffffffffe),
                                 (DdNode *)((ulong)pDVar9 ^ 1));
        if (pDVar6 == (DdNode *)0x0) goto LAB_008009ea;
        pDVar6 = (DdNode *)((ulong)pDVar6 ^ 1);
      }
    }
    piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
    piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
    bVar4 = true;
  }
  if (!bVar4) {
    return (DdNode *)0x0;
  }
LAB_00800a03:
  cuddCacheInsert2(dd,extraBddChangePolarity,bFunc,bVars,pDVar6);
  return pDVar6;
}

Assistant:

DdNode * extraBddChangePolarity( 
  DdManager * dd,    /* the DD manager */
  DdNode * bFunc, 
  DdNode * bVars) 
{
    DdNode * bRes;

    if ( bVars == b1 )
        return bFunc;
    if ( Cudd_IsConstant(bFunc) )
        return bFunc;

    if ( (bRes = cuddCacheLookup2(dd, extraBddChangePolarity, bFunc, bVars)) )
        return bRes;
    else
    {
        DdNode * bFR = Cudd_Regular(bFunc); 
        int LevelF   = dd->perm[bFR->index];
        int LevelV   = dd->perm[bVars->index];

        if ( LevelV < LevelF )
            bRes = extraBddChangePolarity( dd, bFunc, cuddT(bVars) );
        else // if ( LevelF <= LevelV )
        {
            DdNode * bRes0, * bRes1;             
            DdNode * bF0, * bF1;             
            DdNode * bVarsNext;

            // cofactor the functions
            if ( bFR != bFunc ) // bFunc is complemented 
            {
                bF0 = Cudd_Not( cuddE(bFR) );
                bF1 = Cudd_Not( cuddT(bFR) );
            }
            else
            {
                bF0 = cuddE(bFR);
                bF1 = cuddT(bFR);
            }

            if ( LevelF == LevelV )
                bVarsNext = cuddT(bVars);
            else
                bVarsNext = bVars;

            bRes0 = extraBddChangePolarity( dd, bF0, bVarsNext );
            if ( bRes0 == NULL ) 
                return NULL;
            cuddRef( bRes0 );

            bRes1 = extraBddChangePolarity( dd, bF1, bVarsNext );
            if ( bRes1 == NULL ) 
            {
                Cudd_RecursiveDeref( dd, bRes0 );
                return NULL;
            }
            cuddRef( bRes1 );

            if ( LevelF == LevelV )
            { // swap the cofactors
                DdNode * bTemp;
                bTemp = bRes0;
                bRes0 = bRes1;
                bRes1 = bTemp;
            }

            /* only aRes0 and aRes1 are referenced at this point */

            /* consider the case when Res0 and Res1 are the same node */
            if ( bRes0 == bRes1 )
                bRes = bRes1;
            /* consider the case when Res1 is complemented */
            else if ( Cudd_IsComplement(bRes1) ) 
            {
                bRes = cuddUniqueInter(dd, bFR->index, Cudd_Not(bRes1), Cudd_Not(bRes0));
                if ( bRes == NULL ) 
                {
                    Cudd_RecursiveDeref(dd,bRes0);
                    Cudd_RecursiveDeref(dd,bRes1);
                    return NULL;
                }
                bRes = Cudd_Not(bRes);
            } 
            else 
            {
                bRes = cuddUniqueInter( dd, bFR->index, bRes1, bRes0 );
                if ( bRes == NULL ) 
                {
                    Cudd_RecursiveDeref(dd,bRes0);
                    Cudd_RecursiveDeref(dd,bRes1);
                    return NULL;
                }
            }
            cuddDeref( bRes0 );
            cuddDeref( bRes1 );
        }
            
        /* insert the result into cache */
        cuddCacheInsert2(dd, extraBddChangePolarity, bFunc, bVars, bRes);
        return bRes;
    }
}